

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_7c86d6::HandleFilterCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string_view pattern_00;
  undefined8 name;
  cmExecutionStatus *pcVar1;
  bool bVar2;
  size_type sVar3;
  const_reference var;
  cmMakefile *pcVar4;
  cmList *pcVar5;
  invalid_argument *e;
  string local_190;
  string_view local_170;
  const_reference local_160;
  string *pattern;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_110;
  string *mode;
  undefined1 local_100 [8];
  optional<cmList> list;
  string *listName;
  FilterMode local_b4;
  const_reference pvStack_b0;
  FilterMode filterMode;
  string *op;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar1 = local_20;
  if (sVar3 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"sub-command FILTER requires a list to be specified.",&local_41);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)status_local);
    pcVar1 = local_20;
    if (sVar3 < 3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"sub-command FILTER requires an operator to be specified.",
                 &local_79);
      cmExecutionStatus::SetError(pcVar1,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      args_local._7_1_ = 0;
    }
    else {
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local);
      pcVar1 = local_20;
      if (sVar3 < 4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"sub-command FILTER requires a mode to be specified.",
                   (allocator<char> *)((long)&op + 7));
        cmExecutionStatus::SetError(pcVar1,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&op + 7));
        args_local._7_1_ = 0;
      }
      else {
        pvStack_b0 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)status_local,2);
        bVar2 = std::operator==(pvStack_b0,"INCLUDE");
        if (bVar2) {
          local_b4 = INCLUDE;
        }
        else {
          bVar2 = std::operator==(pvStack_b0,"EXCLUDE");
          pcVar1 = local_20;
          if (!bVar2) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &listName,"sub-command FILTER does not recognize operator ",pvStack_b0);
            cmExecutionStatus::SetError
                      (pcVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &listName);
            std::__cxx11::string::~string((string *)&listName);
            args_local._7_1_ = 0;
            goto LAB_004f7a5b;
          }
          local_b4 = EXCLUDE;
        }
        var = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local,1);
        list.super__Optional_base<cmList,_false,_false>._M_payload.
        super__Optional_payload<cmList,_true,_false,_false>.super__Optional_payload_base<cmList>.
        _24_8_ = var;
        pcVar4 = cmExecutionStatus::GetMakefile(local_20);
        GetList((optional<cmList> *)local_100,var,pcVar4);
        bVar2 = std::optional::operator_cast_to_bool((optional *)local_100);
        if (bVar2) {
          local_110 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)status_local,3);
          bVar2 = std::operator!=(local_110,"REGEX");
          pcVar1 = local_20;
          if (bVar2) {
            std::operator+(&local_130,"sub-command FILTER does not recognize mode ",local_110);
            cmExecutionStatus::SetError(pcVar1,&local_130);
            std::__cxx11::string::~string((string *)&local_130);
            args_local._7_1_ = 0;
          }
          else {
            sVar3 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local);
            pcVar1 = local_20;
            if (sVar3 == 5) {
              local_160 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        *)status_local,4);
              pcVar4 = cmExecutionStatus::GetMakefile(local_20);
              name = list.super__Optional_base<cmList,_false,_false>._M_payload.
                     super__Optional_payload<cmList,_true,_false,_false>.
                     super__Optional_payload_base<cmList>._24_8_;
              pcVar5 = std::optional<cmList>::operator->((optional<cmList> *)local_100);
              pattern_00 = (string_view)
                           std::__cxx11::string::operator_cast_to_basic_string_view
                                     ((string *)local_160);
              pcVar5 = cmList::filter(pcVar5,pattern_00,local_b4);
              cmList::to_string_abi_cxx11_(&local_190,pcVar5);
              local_170 = (string_view)
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    ((string *)&local_190);
              cmMakefile::AddDefinition(pcVar4,(string *)name,local_170);
              std::__cxx11::string::~string((string *)&local_190);
              args_local._7_1_ = 1;
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_150,
                         "sub-command FILTER, mode REGEX requires five arguments.",
                         (allocator<char> *)((long)&pattern + 7));
              cmExecutionStatus::SetError(pcVar1,&local_150);
              std::__cxx11::string::~string((string *)&local_150);
              std::allocator<char>::~allocator((allocator<char> *)((long)&pattern + 7));
              args_local._7_1_ = 0;
            }
          }
        }
        else {
          args_local._7_1_ = 1;
        }
        mode._4_4_ = 1;
        std::optional<cmList>::~optional((optional<cmList> *)local_100);
      }
    }
  }
LAB_004f7a5b:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleFilterCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("sub-command FILTER requires a list to be specified.");
    return false;
  }

  if (args.size() < 3) {
    status.SetError(
      "sub-command FILTER requires an operator to be specified.");
    return false;
  }

  if (args.size() < 4) {
    status.SetError("sub-command FILTER requires a mode to be specified.");
    return false;
  }

  const std::string& op = args[2];
  cmList::FilterMode filterMode;
  if (op == "INCLUDE") {
    filterMode = cmList::FilterMode::INCLUDE;
  } else if (op == "EXCLUDE") {
    filterMode = cmList::FilterMode::EXCLUDE;
  } else {
    status.SetError("sub-command FILTER does not recognize operator " + op);
    return false;
  }

  const std::string& listName = args[1];
  // expand the variable
  auto list = GetList(listName, status.GetMakefile());

  if (!list) {
    return true;
  }

  const std::string& mode = args[3];
  if (mode != "REGEX") {
    status.SetError("sub-command FILTER does not recognize mode " + mode);
    return false;
  }
  if (args.size() != 5) {
    status.SetError("sub-command FILTER, mode REGEX "
                    "requires five arguments.");
    return false;
  }
  const std::string& pattern = args[4];

  try {
    status.GetMakefile().AddDefinition(
      listName, list->filter(pattern, filterMode).to_string());
    return true;
  } catch (std::invalid_argument& e) {
    status.SetError(e.what());
    return false;
  }
}